

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_sample.cpp
# Opt level: O1

unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> __thiscall
duckdb::ReservoirSample::GetChunk(ReservoirSample *this)

{
  sel_t *psVar1;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> _Var2;
  pointer pRVar3;
  DataChunk *pDVar4;
  idx_t iVar5;
  pointer pBVar6;
  ulong uVar7;
  pointer pDVar8;
  ReservoirSample *in_RSI;
  idx_t iVar9;
  idx_t iVar10;
  pair<double,_unsigned_long> pVar11;
  templated_unique_single_t ret;
  SelectionVector ret_sel;
  vector<duckdb::LogicalType,_true> reservoir_types;
  _Head_base<0UL,_duckdb::DataChunk_*,_false> local_80;
  unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true> *local_78;
  idx_t local_70;
  ulong local_68;
  SelectionVector local_60;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  if (((in_RSI->super_BlockingSample).destroyed == false) &&
     ((in_RSI->reservoir_chunk).
      super_unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>._M_t.
      super___uniq_ptr_impl<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::ReservoirChunk_*,_std::default_delete<duckdb::ReservoirChunk>_>
      .super__Head_base<0UL,_duckdb::ReservoirChunk_*,_false>._M_head_impl != (ReservoirChunk *)0x0)
     ) {
    local_78 = &in_RSI->reservoir_chunk;
    pRVar3 = unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>::
             operator->(local_78);
    if ((pRVar3->chunk).count != 0) {
      pDVar4 = (DataChunk *)operator_new(0x40);
      DataChunk::DataChunk(pDVar4);
      local_80._M_head_impl = pDVar4;
      SelectionVector::SelectionVector(&local_60,0x800);
      iVar5 = GetActiveSampleCount(in_RSI);
      if (iVar5 == 0) {
        (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)0x0;
      }
      else {
        local_68 = 0;
        if (0x7ff < iVar5) {
          local_68 = iVar5 - 0x800;
        }
        local_70 = 0x800;
        if (0x7ff >= iVar5) {
          local_70 = iVar5;
        }
        if (local_68 < iVar5) {
          iVar10 = 0x800;
          if (iVar5 < 0x800) {
            iVar10 = iVar5;
          }
          iVar9 = 0;
          do {
            pBVar6 = unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>,_true>
                     ::operator->(&(in_RSI->super_BlockingSample).base_reservoir_sample);
            if ((pBVar6->reservoir_weights).c.
                super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (pBVar6->reservoir_weights).c.
                super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              psVar1 = (in_RSI->sel).sel_vector;
              if (psVar1 == (sel_t *)0x0) {
                uVar7 = local_68 + iVar9;
              }
              else {
                uVar7 = (ulong)*(uint *)((long)psVar1 +
                                        iVar9 * 4 + (iVar5 * 4 - (ulong)(uint)((int)iVar10 * 4)));
              }
            }
            else {
              pVar11 = BlockingSample::PopFromWeightQueue(&in_RSI->super_BlockingSample);
              uVar7 = pVar11.second;
              psVar1 = (in_RSI->sel).sel_vector;
              if (psVar1 != (sel_t *)0x0) {
                uVar7 = (ulong)psVar1[uVar7];
              }
            }
            local_60.sel_vector[iVar9] = (sel_t)uVar7;
            in_RSI->sel_size = in_RSI->sel_size - 1;
            iVar9 = iVar9 + 1;
          } while (iVar10 != iVar9);
        }
        pDVar4 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                  ::operator->(local_78)->chunk;
        DataChunk::GetTypes((vector<duckdb::LogicalType,_true> *)&local_48,pDVar4);
        pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_80);
        iVar5 = local_70;
        DataChunk::Initialize
                  (pDVar8,in_RSI->allocator,(vector<duckdb::LogicalType,_true> *)&local_48,0x800);
        pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_80);
        pDVar4 = &unique_ptr<duckdb::ReservoirChunk,_std::default_delete<duckdb::ReservoirChunk>,_true>
                  ::operator->(local_78)->chunk;
        DataChunk::Slice(pDVar8,pDVar4,&local_60,iVar5,0);
        pDVar8 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
                 operator->((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
                             *)&local_80);
        pDVar8->count = iVar5;
        (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)local_80._M_head_impl;
        local_80._M_head_impl = (DataChunk *)0x0;
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48)
        ;
      }
      if (local_60.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      _Var2._M_head_impl = local_80._M_head_impl;
      if (local_80._M_head_impl == (DataChunk *)0x0) {
        return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
               (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
      }
      DataChunk::~DataChunk(local_80._M_head_impl);
      operator_delete(_Var2._M_head_impl);
      return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
             (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
    }
  }
  (this->super_BlockingSample)._vptr_BlockingSample = (_func_int **)0x0;
  return (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)
         (unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>)this;
}

Assistant:

unique_ptr<DataChunk> ReservoirSample::GetChunk() {
	if (destroyed || !reservoir_chunk || Chunk().size() == 0) {
		return nullptr;
	}
	// cannot destory internal samples.
	auto ret = make_uniq<DataChunk>();

	SelectionVector ret_sel(STANDARD_VECTOR_SIZE);
	idx_t collected_samples = GetActiveSampleCount();

	if (collected_samples == 0) {
		return nullptr;
	}

	idx_t samples_remaining;
	idx_t return_chunk_size;
	if (collected_samples > STANDARD_VECTOR_SIZE) {
		samples_remaining = collected_samples - STANDARD_VECTOR_SIZE;
		return_chunk_size = STANDARD_VECTOR_SIZE;
	} else {
		samples_remaining = 0;
		return_chunk_size = collected_samples;
	}

	for (idx_t i = samples_remaining; i < collected_samples; i++) {
		// pop samples and reduce size of selection vector.
		if (GetSamplingState() == SamplingState::RESERVOIR) {
			auto top = PopFromWeightQueue();
			ret_sel.set_index(i - samples_remaining, sel.get_index(top.second));
		} else {
			ret_sel.set_index(i - samples_remaining, sel.get_index(i));
		}
		sel_size -= 1;
	}

	auto reservoir_types = Chunk().GetTypes();

	ret->Initialize(allocator, reservoir_types, STANDARD_VECTOR_SIZE);
	ret->Slice(Chunk(), ret_sel, return_chunk_size);
	ret->SetCardinality(return_chunk_size);
	return ret;
}